

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

Bool IsFilePath(ctmbstr path)

{
  char cVar1;
  char *pcVar2;
  bool local_29;
  int local_20;
  states state;
  char c;
  char *p;
  ctmbstr path_local;
  
  local_20 = 0;
  _state = path;
  while( true ) {
    pcVar2 = _state + 1;
    cVar1 = *_state;
    if (cVar1 == '\0' || local_20 == 3) break;
    _state = pcVar2;
    if (local_20 == 0) {
      if (cVar1 == ':') {
        local_20 = 1;
      }
    }
    else if (local_20 == 1) {
      if (cVar1 == '/') {
        local_20 = 2;
      }
    }
    else if (local_20 == 2) {
      if (cVar1 == '/') {
        local_20 = 1;
      }
      else {
        local_20 = 3;
      }
    }
  }
  local_29 = local_20 == 3 || local_20 == 0;
  return (Bool)local_29;
}

Assistant:

static Bool IsFilePath( ctmbstr path )
{
    const char *p = path;
    char c;
    typedef enum states { initial, protocol_found, slash_found, file_found } states;
    states state = initial;

    while ( ( c = *p++ ) != 0 && state != file_found )
    {
        switch ( state )
        {
            case initial:
                if ( c == ':' )
                    state = protocol_found;
                break;

            case protocol_found:
                if ( c =='/' )
                    state = slash_found;
                break;

            case slash_found:
                if ( c =='/' )
                    state = protocol_found;
                else
                    state = file_found;
                break;
                
            default:
                break;
        }
        
    }
    
    return state == file_found || state == initial;
}